

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall Glucose::Solver::adaptSolver(Solver *this)

{
  unsigned_long *puVar1;
  ulong uVar2;
  uint *puVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  
  bVar5 = (float)this->decisions / (float)this->conflicts <= 1.2;
  if (bVar5) {
    this->chanseokStrategy = true;
    this->coLBDBound = 4;
    this->glureduce = true;
    this->firstReduceDB = 2000;
    this->incReduceDB = 0;
    this->nbclausesbeforereduce = 2000;
    this->curRestart = this->conflicts / 2000 + 1;
  }
  puVar1 = (this->stats).data;
  uVar2 = puVar1[0x17];
  bVar4 = uVar2 < 30000;
  if (bVar4) {
    this->luby_restart = true;
    this->luby_restart_factor = 100;
    this->var_decay = 0.999;
    this->max_var_decay = 0.999;
  }
  bVar11 = 0xd480 < uVar2;
  if (bVar11) {
    this->chanseokStrategy = true;
    this->glureduce = true;
    this->coLBDBound = 3;
    this->firstReduceDB = 30000;
    this->var_decay = 0.99;
    this->max_var_decay = 0.99;
    this->randomize_on_restarts = true;
  }
  bVar12 = 20000 < puVar1[10] - puVar1[0xb];
  if (bVar12) {
    this->var_decay = 0.91;
    this->max_var_decay = 0.91;
  }
  if (bVar12 || (bVar11 || (bVar4 || bVar5))) {
    (this->lbdQueue).queuesize = 0;
    (this->lbdQueue).first = 0;
    (this->lbdQueue).last = 0;
    (this->lbdQueue).sumofqueue = 0;
    this->sumLBD = 0.0;
    this->conflictsRestarts = 0;
  }
  if (((bVar12 || (bVar11 || (bVar4 || bVar5))) & this->chanseokStrategy) == 1) {
    iVar6 = (this->learnts).sz;
    if (iVar6 < 1) {
      iVar8 = 0;
    }
    else {
      lVar9 = 0;
      lVar10 = 0;
      iVar8 = 0;
      do {
        puVar3 = (this->learnts).data;
        if ((uint)this->coLBDBound <
            ((this->ca).super_RegionAllocator<unsigned_int>.memory[*(uint *)((long)puVar3 + lVar9)]
             >> 0xb & 0xfffff)) {
          lVar7 = (long)iVar8;
          iVar8 = iVar8 + 1;
          puVar3[lVar7] = *(uint *)((long)puVar3 + lVar9);
        }
        else {
          vec<unsigned_int>::push(&this->permanentLearnts,(uint *)((long)puVar3 + lVar9));
        }
        lVar10 = lVar10 + 1;
        iVar6 = (this->learnts).sz;
        lVar9 = lVar9 + 4;
      } while (lVar10 < iVar6);
      iVar8 = (int)lVar10 - iVar8;
    }
    if (0 < iVar8) {
      (this->learnts).sz = iVar6 - iVar8;
    }
  }
  if (bVar5) {
    if (0 < (this->learnts).sz) {
      lVar9 = 0;
      do {
        removeClause(this,(this->learnts).data[lVar9],false);
        lVar9 = lVar9 + 1;
        iVar6 = (this->learnts).sz;
      } while (lVar9 < iVar6);
      if (0 < iVar6) {
        (this->learnts).sz = 0;
      }
    }
    if ((double)(this->ca).super_RegionAllocator<unsigned_int>.sz * this->garbage_frac <
        (double)(this->ca).super_RegionAllocator<unsigned_int>.wasted_) {
      (*(this->super_Clone)._vptr_Clone[5])(this);
      return;
    }
  }
  return;
}

Assistant:

void Solver::adaptSolver() {
    bool adjusted = false;
    bool reinit = false;
    // printf("c\nc Try to adapt solver strategies\nc \n");
    /*  printf("c Adjusting solver for the SAT Race 2015 (alpha feature)\n");
    printf("c key successive Conflicts       : %" PRIu64"\n",stats[noDecisionConflict]);
    printf("c nb unary clauses learnt        : %" PRIu64"\n",stats[nbUn]);
    printf("c key avg dec per conflicts      : %.2f\n", (float)decisions / (float)conflicts);*/
    float decpc = (float) decisions / (float) conflicts;
    if(decpc <= 1.2) {
        chanseokStrategy = true;
        coLBDBound = 4;
        glureduce = true;
        adjusted = true;
        // printf("c Adjusting for low decision levels.\n");
        reinit = true;
        firstReduceDB = 2000;
        nbclausesbeforereduce = firstReduceDB;
        curRestart = (conflicts / nbclausesbeforereduce) + 1;
        incReduceDB = 0;
    }
    if(stats[noDecisionConflict] < 30000) {
        luby_restart = true;
        luby_restart_factor = 100;

        var_decay = 0.999;
        max_var_decay = 0.999;
        adjusted = true;
        // printf("c Adjusting for low successive conflicts.\n");
    }
    if(stats[noDecisionConflict] > 54400) {
        // printf("c Adjusting for high successive conflicts.\n");
        chanseokStrategy = true;
        glureduce = true;
        coLBDBound = 3;
        firstReduceDB = 30000;
        var_decay = 0.99;
        max_var_decay = 0.99;
        randomize_on_restarts = 1;
        adjusted = true;
    }
    if(stats[nbDL2] - stats[nbBin] > 20000) {
        var_decay = 0.91;
        max_var_decay = 0.91;
        adjusted = true;
        // printf("c Adjusting for a very large number of true glue clauses found.\n");
    }
    if(!adjusted) {
        // printf("c Nothing extreme in this problem, continue with glucose default strategies.\n");
    }
    // printf("c\n");
    if(adjusted) { // Let's reinitialize the glucose restart strategy counters
        lbdQueue.fastclear();
        sumLBD = 0;
        conflictsRestarts = 0;
    }

    if(chanseokStrategy && adjusted) {
        int moved = 0;
        int i, j;
        for(i = j = 0; i < learnts.size(); i++) {
            Clause &c = ca[learnts[i]];
            if(c.lbd() <= coLBDBound) {
                permanentLearnts.push(learnts[i]);
                moved++;
            }
            else {
                learnts[j++] = learnts[i];
            }
        }
        learnts.shrink(i - j);
        // printf("c Activating Chanseok Strategy: moved %d clauses to the permanent set.\n", moved);
    }

    if(reinit) {
        assert(decisionLevel() == 0);
        for(int i = 0; i < learnts.size(); i++) {
            removeClause(learnts[i]);
        }
        learnts.shrink(learnts.size());
        checkGarbage();
/*
	order_heap.clear();
	for(int i=0;i<nVars();i++) {
	    polarity[i] = true; 
	    activity[i]=0.0;
	    if (decision[i]) order_heap.insert(i);
	}
	printf("c reinitialization of all variables activity/phase/learnt clauses.\n");
*/
        // printf("c Removing of non permanent clauses.\n");
    }

}